

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitUnary(I64ToI32Lowering *this,Unary *curr)

{
  bool bVar1;
  ostream *this_00;
  void *this_01;
  bool local_29;
  BasicType local_20 [2];
  Unary *local_18;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  local_18 = curr;
  curr_local = (Unary *)this;
  bVar1 = unaryNeedsLowering(this,curr->op);
  if ((bVar1) && (bVar1 = handleUnreachable(this,(Expression *)local_18), !bVar1)) {
    bVar1 = hasOutParam(this,local_18->value);
    local_29 = true;
    if (!bVar1) {
      local_20[1] = 3;
      bVar1 = wasm::Type::operator==
                        (&(local_18->super_SpecificExpression<(wasm::Expression::Id)15>).
                          super_Expression.type,local_20 + 1);
      local_29 = true;
      if (!bVar1) {
        local_20[0] = f64;
        local_29 = wasm::Type::operator==
                             (&(local_18->super_SpecificExpression<(wasm::Expression::Id)15>).
                               super_Expression.type,local_20);
      }
    }
    if (local_29 == false) {
      __assert_fail("hasOutParam(curr->value) || curr->type == Type::i64 || curr->type == Type::f64"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x3ae,"void wasm::I64ToI32Lowering::visitUnary(Unary *)");
    }
    switch(local_18->op) {
    case ClzInt64:
    case CtzInt64:
      lowerCountZeros(this,local_18);
      break;
    default:
      this_00 = std::operator<<((ostream *)&std::cerr,"Unhandled unary operator: ");
      this_01 = (void *)std::ostream::operator<<(this_00,local_18->op);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      abort();
    case PopcntInt64:
      handle_unreachable("i64.popcnt should already be removed",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                         ,0x3d8);
    case EqZInt64:
      lowerEqZInt64(this,local_18);
      break;
    case ExtendSInt32:
      lowerExtendSInt32(this,local_18);
      break;
    case ExtendUInt32:
      lowerExtendUInt32(this,local_18);
      break;
    case WrapInt64:
      lowerWrapInt64(this,local_18);
      break;
    case TruncSFloat32ToInt64:
    case TruncUFloat32ToInt64:
    case TruncSFloat64ToInt64:
    case TruncUFloat64ToInt64:
      lowerTruncFloatToInt(this,local_18);
      break;
    case ReinterpretFloat64:
      lowerReinterpretFloat64(this,local_18);
      break;
    case ConvertSInt64ToFloat32:
    case ConvertSInt64ToFloat64:
    case ConvertUInt64ToFloat32:
    case ConvertUInt64ToFloat64:
      lowerConvertIntToFloat(this,local_18);
      break;
    case ReinterpretInt64:
      lowerReinterpretInt64(this,local_18);
      break;
    case ExtendS8Int64:
    case ExtendS16Int64:
    case ExtendS32Int64:
      lowerExtendSInt64(this,local_18);
    }
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (!unaryNeedsLowering(curr->op)) {
      return;
    }
    if (handleUnreachable(curr)) {
      return;
    }
    assert(hasOutParam(curr->value) || curr->type == Type::i64 ||
           curr->type == Type::f64);
    switch (curr->op) {
      case ClzInt64:
      case CtzInt64:
        lowerCountZeros(curr);
        break;
      case EqZInt64:
        lowerEqZInt64(curr);
        break;
      case ExtendSInt32:
        lowerExtendSInt32(curr);
        break;
      case ExtendUInt32:
        lowerExtendUInt32(curr);
        break;
      case WrapInt64:
        lowerWrapInt64(curr);
        break;
      case ReinterpretFloat64:
        lowerReinterpretFloat64(curr);
        break;
      case ReinterpretInt64:
        lowerReinterpretInt64(curr);
        break;
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64:
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64:
        lowerTruncFloatToInt(curr);
        break;
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        lowerConvertIntToFloat(curr);
        break;
      case ExtendS8Int64:
      case ExtendS16Int64:
      case ExtendS32Int64:
        lowerExtendSInt64(curr);
        break;
      case PopcntInt64:
        WASM_UNREACHABLE("i64.popcnt should already be removed");
      default:
        std::cerr << "Unhandled unary operator: " << curr->op << std::endl;
        abort();
    }
  }